

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ConditionalExpressionSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ConditionalExpressionSyntax *this,size_t index
          )

{
  Token token;
  Token token_00;
  ConditionalPredicateSyntax *node;
  SyntaxNode *pSVar1;
  SyntaxNode *local_60;
  size_t index_local;
  ConditionalExpressionSyntax *this_local;
  
  switch(index) {
  case 0:
    node = not_null<slang::syntax::ConditionalPredicateSyntax_*>::get(&this->predicate);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&node->super_SyntaxNode);
    break;
  case 1:
    token.kind = (this->question).kind;
    token._2_1_ = (this->question).field_0x2;
    token.numFlags.raw = (this->question).numFlags.raw;
    token.rawLen = (this->question).rawLen;
    token.info = (this->question).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 2:
    local_60 = (SyntaxNode *)0x0;
    if (this != (ConditionalExpressionSyntax *)0xffffffffffffffd8) {
      local_60 = &(this->attributes).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_60);
    break;
  case 3:
    pSVar1 = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->left)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,pSVar1);
    break;
  case 4:
    token_00.kind = (this->colon).kind;
    token_00._2_1_ = (this->colon).field_0x2;
    token_00.numFlags.raw = (this->colon).numFlags.raw;
    token_00.rawLen = (this->colon).rawLen;
    token_00.info = (this->colon).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 5:
    pSVar1 = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->right)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,pSVar1);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ConditionalExpressionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return predicate.get();
        case 1: return question;
        case 2: return &attributes;
        case 3: return left.get();
        case 4: return colon;
        case 5: return right.get();
        default: return nullptr;
    }
}